

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_mat2rpy(double *rpy,double *R)

{
  double __x;
  double dVar1;
  double local_30;
  double dm;
  double dp;
  double pi2;
  double *R_local;
  double *rpy_local;
  
  dVar1 = R[2];
  __x = sqrt(R[5] * R[5] + R[8] * R[8]);
  dVar1 = atan2(dVar1,__x);
  rpy[1] = dVar1;
  if (0.5 <= ABS(R[2])) {
    dm = atan2(R[3] - R[7],R[6] + R[4]);
    local_30 = atan2(R[3] + R[7],R[6] - R[4]);
    local_30 = -local_30;
    if (((0.0 < *R) || (0.0 < -R[8])) || (dm <= 0.0)) {
      if (((*R < 0.0) || (-R[8] < 0.0)) || (0.0 <= dm)) {
        if (((0.0 < *R) || (-R[8] < 0.0)) || (local_30 <= 0.0)) {
          if (((0.0 <= *R) && (-R[8] <= 0.0)) && (local_30 < 0.0)) {
            local_30 = local_30 + 6.283185307179586;
          }
        }
        else {
          local_30 = local_30 - 6.283185307179586;
        }
      }
      else {
        dm = dm + 6.283185307179586;
      }
    }
    else {
      dm = dm - 6.283185307179586;
    }
    *rpy = (dm - local_30) / 2.0;
    rpy[2] = (dm + local_30) / 2.0;
  }
  else {
    dVar1 = atan2(R[8],R[5]);
    *rpy = -dVar1;
    dVar1 = atan2(*R,R[1]);
    rpy[2] = dVar1;
  }
  return;
}

Assistant:

void fsnav_linal_mat2rpy(double* rpy, double* R)
{
	const double pi2 = 6.283185307179586476925286766559005768; // pi*2, IEEE-754 quadruple precision
	double dp, dm;

	rpy[1] = atan2(R[2], sqrt(R[5]*R[5] + R[8]*R[8])); // pitch angle

	if (fabs(R[2]) < 0.5) {          // pitch magnitude below 30 deg
		rpy[0] = -atan2(R[8], R[5]); // roll angle
		rpy[2] =  atan2(R[0], R[1]); // yaw  angle
	}
	else {                           // pitch magnitude over 30 deg
		dp =  atan2(R[3]-R[7], R[6]+R[4]);
		dm = -atan2(R[3]+R[7], R[6]-R[4]);

		if (R[0] <= 0 && -R[8] <= 0 && dp > 0)      dp -= pi2;
		else if (R[0] >= 0 && -R[8] >= 0 && dp < 0) dp += pi2;
		else if (R[0] <= 0 && -R[8] >= 0 && dm > 0) dm -= pi2;
		else if (R[0] >= 0 && -R[8] <= 0 && dm < 0) dm += pi2;

		rpy[0] = (dp - dm)/2; // roll angle
		rpy[2] = (dp + dm)/2; // yaw  angle
	}
}